

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O2

Node * __thiscall Rectangles::update(Rectangles *this,Node *root)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TextureNode *child;
  ulong uVar4;
  ulong uVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  rect2d rect;
  rect2d rect_00;
  vec4 color;
  Texture *local_58;
  Rectangles *local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  Node *local_38;
  
  if (interleaved == 1) {
    uVar4 = (long)nodeCount / 2 & 0xffffffff;
  }
  else {
    uVar4 = 0;
    if (textured != '\0') {
      uVar4 = (ulong)(uint)nodeCount;
    }
  }
  if ((long)texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar4) {
    while (iVar1 = (int)uVar4, uVar4 = (ulong)(iVar1 - 1), iVar1 != 0) {
      local_58 = rengine::rengine_fractalTexture
                           ((this->super_StandardSurface).m_renderer._M_t.
                            super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>
                            .super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl,
                            (vec2)0x41a0000042c80000);
      std::vector<rengine::Texture*,std::allocator<rengine::Texture*>>::
      emplace_back<rengine::Texture*>
                ((vector<rengine::Texture*,std::allocator<rengine::Texture*>> *)&texturePool,
                 &local_58);
    }
  }
  if (root != (Node *)0x0) {
    (*(root->super_SignalEmitter)._vptr_SignalEmitter[2])(root);
  }
  rengine::rengine_countFps();
  local_38 = rengine::Node::create();
  local_50 = this;
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
  uVar5 = 0;
  uVar4 = (ulong)(uint)nodeCount;
  if (nodeCount < 1) {
    uVar4 = uVar5;
  }
  for (; (int)uVar4 != (int)uVar5; uVar5 = (ulong)((int)uVar5 + 1)) {
    iVar1 = rand();
    local_48 = (float)(iVar1 % (int)(extraout_XMM0_Da + -100.0));
    fStack_44 = (float)extraout_XMM0_Db_00;
    iVar1 = rand();
    fVar6 = (float)(iVar1 % (int)(extraout_XMM0_Db + -20.0));
    rect.br.x = local_48 + 100.0;
    uStack_40 = fStack_44;
    fStack_44 = fVar6;
    if ((textured == '\0') && (((uVar5 & 1) == 0 || ((interleaved & 1) == 0)))) {
      iVar1 = rand();
      iVar2 = rand();
      iVar3 = rand();
      child = (TextureNode *)rengine::RectangleNode::create();
      rect_00.tl.y = fStack_44;
      rect_00.tl.x = local_48;
      rect_00.br.y = fVar6 + 20.0;
      rect_00.br.x = rect.br.x;
      rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)child,rect_00);
      color.w = 0.9;
      color.z = (float)(iVar3 % 100) / 100.0;
      color.y = (float)(iVar2 % 100) / 100.0;
      color.x = (float)(iVar1 % 100) / 100.0;
      rengine::RectangleNode::setColor((RectangleNode *)child,color);
    }
    else {
      child = rengine::TextureNode::create();
      rect.tl.y = fStack_44;
      rect.tl.x = local_48;
      rect.br.y = fVar6 + 20.0;
      rengine::RectangleNodeBase::setGeometry(&child->super_RectangleNodeBase,rect);
      child->m_texture =
           texturePool.super__Vector_base<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar5 >> 1];
    }
    rengine::Node::append(local_38,(Node *)child);
  }
  (*((local_50->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[8])();
  return local_38;
}

Assistant:

Node *update(Node *root) override {

        // if --textures, we have nodeCount textures (all the nodes)
        // if --interleaved, we have half of them.
        const unsigned int textureCount = interleaved ? nodeCount / 2 : (textured ? nodeCount : 0);

        if (texturePool.size() != textureCount) {
            for (unsigned int i=0; i<textureCount; ++i) {
                texturePool.push_back(rengine_fractalTexture(renderer(), vec2(100, 20)));
            }
        }

        if (root)
            root->destroy();

        rengine_countFps();

        root = Node::create();

        vec2 s = size();

        int rw = 100;
        int rh = 20;
        int w = s.x - rw;
        int h = s.y - rh;

        int count = nodeCount;

        for (int i=0; i<count; ++i) {

            rect2d geometry = rect2d::fromXywh(rand() % w, rand() % h, rw, rh);

            if (textured || (interleaved && (i % 2) == 1)) {
                TextureNode *tn = TextureNode::create();
                tn->setGeometry(geometry);
                tn->setTexture(texturePool[i / 2]);
                *root << tn;
            } else {
                vec4 color((rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           0.9);
                RectangleNode *rect = RectangleNode::create();
                rect->setGeometry(geometry);
                rect->setColor(color);
                *root << rect;
            }
        }

        requestRender();

        return root;
    }